

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# find_empty_space.cpp
# Opt level: O0

Screen_mask * cppurses::detail::find_empty_space(Screen_mask *__return_storage_ptr__,Widget *w)

{
  bool bVar1;
  Widget *w_local;
  Screen_mask *mask;
  
  bVar1 = anon_unknown.dwarf_1b36a7::children_completely_cover(w);
  if (bVar1) {
    memset(__return_storage_ptr__,0,0x48);
    Screen_mask::Screen_mask(__return_storage_ptr__);
  }
  else {
    Screen_mask::Screen_mask(__return_storage_ptr__,w,Inner);
    anon_unknown.dwarf_1b36a7::mark_covered_tiles(w,__return_storage_ptr__);
    Screen_mask::flip(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Screen_mask find_empty_space(const Widget& w) {
    if (children_completely_cover(w)) {
        return Screen_mask{};
    }
    auto mask = Screen_mask{w, Screen_mask::Inner};
    mark_covered_tiles(w, mask);
    mask.flip();
    return mask;
}